

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O0

void __thiscall sc_core::sc_event::trigger(sc_event *this)

{
  bool bVar1;
  uint64 uVar2;
  size_type sVar3;
  reference ppsVar4;
  reference ppsVar5;
  long in_RDI;
  sc_thread_handle thread_h_1;
  int i_3;
  sc_thread_handle *l_threads_dynamic;
  sc_thread_handle thread_h;
  int i_2;
  sc_thread_handle *l_threads_static;
  sc_method_handle method_h_1;
  int i_1;
  sc_method_handle *l_methods_dynamic;
  sc_method_handle method_h;
  int i;
  sc_method_handle *l_methods_static;
  int size;
  int last_i;
  sc_thread_process *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar6;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  reference in_stack_ffffffffffffffb8;
  sc_method_process *in_stack_ffffffffffffffc0;
  int local_34;
  int local_1c;
  int local_c;
  
  uVar2 = sc_simcontext::change_stamp(*(sc_simcontext **)(in_RDI + 0x28));
  *(uint64 *)(in_RDI + 0x30) = uVar2;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  sVar3 = std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::
          size((vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                *)(in_RDI + 0x48));
  if ((int)sVar3 != 0) {
    std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::
    operator[]((vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                *)(in_RDI + 0x48),0);
    local_1c = (int)sVar3 + -1;
    do {
      sc_method_process::trigger_static((sc_method_process *)in_stack_ffffffffffffff90);
      local_1c = local_1c + -1;
    } while (-1 < local_1c);
  }
  sVar3 = std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::
          size((vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                *)(in_RDI + 0x60));
  if ((int)sVar3 != 0) {
    local_c = (int)sVar3 + -1;
    ppsVar4 = std::
              vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::
              operator[]((vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                          *)(in_RDI + 0x60),0);
    for (local_34 = 0; local_34 <= local_c; local_34 = local_34 + 1) {
      in_stack_ffffffffffffffc0 = ppsVar4[local_34];
      bVar1 = sc_method_process::trigger_dynamic
                        ((sc_method_process *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (sc_event *)in_stack_ffffffffffffff90);
      if (bVar1) {
        ppsVar4[local_34] = ppsVar4[local_c];
        local_c = local_c + -1;
        local_34 = local_34 + -1;
      }
    }
    std::vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>::resize
              ((vector<sc_core::sc_method_process_*,_std::allocator<sc_core::sc_method_process_*>_>
                *)in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,
               (value_type)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  sVar3 = std::vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::
          size((vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                *)(in_RDI + 0x78));
  if ((int)sVar3 != 0) {
    in_stack_ffffffffffffffb8 =
         std::vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::
         operator[]((vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                     *)(in_RDI + 0x78),0);
    in_stack_ffffffffffffffb4 = (int)sVar3 + -1;
    do {
      sc_thread_process::trigger_static(in_stack_ffffffffffffff90);
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + -1;
    } while (-1 < in_stack_ffffffffffffffb4);
  }
  sVar3 = std::vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::
          size((vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                *)(in_RDI + 0x90));
  if ((int)sVar3 != 0) {
    local_c = (int)sVar3 + -1;
    ppsVar5 = std::
              vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::
              operator[]((vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                          *)(in_RDI + 0x90),0);
    for (iVar6 = 0; iVar6 <= local_c; iVar6 = iVar6 + 1) {
      bVar1 = sc_thread_process::trigger_dynamic
                        ((sc_thread_process *)CONCAT44(iVar6,in_stack_ffffffffffffff98),
                         (sc_event *)ppsVar5[iVar6]);
      if (bVar1) {
        ppsVar5[iVar6] = ppsVar5[local_c];
        iVar6 = iVar6 + -1;
        local_c = local_c + -1;
      }
    }
    std::vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>::resize
              ((vector<sc_core::sc_thread_process_*,_std::allocator<sc_core::sc_thread_process_*>_>
                *)in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,
               (value_type)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  return;
}

Assistant:

void
sc_event::trigger()
{
    m_trigger_stamp = m_simc->change_stamp();
    m_notify_type = NONE;
    m_delta_event_index = -1;
    m_timed = 0;

    int       last_i; // index of last element in vector now accessing.
    int       size;   // size of vector now accessing.


    // trigger the static sensitive methods

    if( ( size = m_methods_static.size() ) != 0 )
    {
        sc_method_handle* l_methods_static = &m_methods_static[0];
        int i = size - 1;
        do {
            sc_method_handle method_h = l_methods_static[i];
            method_h->trigger_static();
        } while( -- i >= 0 );
    }

    // trigger the dynamic sensitive methods


    if( ( size = m_methods_dynamic.size() ) != 0 )
    {
	last_i = size - 1;
	sc_method_handle* l_methods_dynamic = &m_methods_dynamic[0];
	for ( int i = 0; i <= last_i; i++ )
	{
	    sc_method_handle method_h = l_methods_dynamic[i];
	    if ( method_h->trigger_dynamic( this ) )
	    {
		l_methods_dynamic[i] = l_methods_dynamic[last_i];
		last_i--;
		i--;
	    }
	}
        m_methods_dynamic.resize(last_i+1);
    }


    // trigger the static sensitive threads

    if( ( size = m_threads_static.size() ) != 0 )
    {
        sc_thread_handle* l_threads_static = &m_threads_static[0];
        int i = size - 1;
        do {
            sc_thread_handle thread_h = l_threads_static[i];
            thread_h->trigger_static();
        } while( -- i >= 0 );
    }

    // trigger the dynamic sensitive threads

    if( ( size = m_threads_dynamic.size() ) != 0 )
    {
	last_i = size - 1;
	sc_thread_handle* l_threads_dynamic = &m_threads_dynamic[0];
	for ( int i = 0; i <= last_i; i++ )
	{
	    sc_thread_handle thread_h = l_threads_dynamic[i];
	    if ( thread_h->trigger_dynamic( this ) )
	    {
		l_threads_dynamic[i] = l_threads_dynamic[last_i];
		i--;
		last_i--;
	    }
	}
        m_threads_dynamic.resize(last_i+1);
    }
}